

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

SQInteger __thiscall
SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr,int *hint,bool *is_line_op)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int curop;
  int mid;
  int low;
  int line;
  int pos;
  int high;
  int op;
  bool *is_line_op_local;
  int *hint_local;
  SQInstruction *curr_local;
  SQFunctionProto *this_local;
  
  iVar3 = (int)((long)curr - (long)this->_instructions >> 3);
  high = (int)this->_nlineinfos + -1;
  if ((hint != (int *)0x0) && (*hint < high)) {
    iVar4 = *hint;
    if ((this->_lineinfos[iVar4]._op < iVar3) && (iVar3 <= this->_lineinfos[iVar4 + 1]._op)) {
      if (is_line_op != (bool *)0x0) {
        *is_line_op = *(int *)&this->_lineinfos[iVar4].field_0x4 < 0;
      }
      return (ulong)(*(uint *)&this->_lineinfos[iVar4].field_0x4 & 0x7fffffff);
    }
    if (iVar3 == this->_lineinfos[iVar4 + 1]._op + 1) {
      iVar4 = iVar4 + 1;
      *hint = iVar4;
      if (is_line_op != (bool *)0x0) {
        *is_line_op = *(int *)&this->_lineinfos[iVar4].field_0x4 < 0;
      }
      return (ulong)(*(uint *)&this->_lineinfos[iVar4].field_0x4 & 0x7fffffff);
    }
    if (iVar3 == 0) {
      if (is_line_op != (bool *)0x0) {
        *is_line_op = *(int *)&this->_lineinfos[iVar4].field_0x4 < 0;
      }
      return (ulong)(*(uint *)&this->_lineinfos->field_0x4 & 0x7fffffff);
    }
  }
  low = 0;
  mid = 0;
  while (low <= high) {
    mid = low + (high - low >> 1);
    iVar4 = this->_lineinfos[mid]._op;
    if (iVar3 < iVar4) {
      high = mid + -1;
    }
    else {
      if ((iVar3 <= iVar4) ||
         (((long)mid < this->_nlineinfos + -1 && (iVar3 <= this->_lineinfos[mid + 1]._op)))) break;
      low = mid + 1;
    }
  }
  while( true ) {
    bVar2 = false;
    if (0 < mid) {
      bVar2 = iVar3 <= this->_lineinfos[mid]._op;
    }
    if (!bVar2) break;
    mid = mid + -1;
  }
  uVar1 = *(uint *)&this->_lineinfos[mid].field_0x4;
  if (is_line_op != (bool *)0x0) {
    *is_line_op = *(int *)&this->_lineinfos[mid].field_0x4 < 0;
  }
  if (hint != (int *)0x0) {
    *hint = mid;
  }
  return (long)(int)(uVar1 & 0x7fffffff);
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr, int *hint, bool *is_line_op)
{
    int op = (int)(curr-_instructions);
    int high = _nlineinfos - 1;

    if (hint && *hint < high) {
        int pos = *hint;
        if (op > _lineinfos[pos]._op && op <= _lineinfos[pos + 1]._op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (op == _lineinfos[pos + 1]._op + 1) {
            *hint = ++pos;
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (!op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[0]._line;
        }
    }

    int line = 0;
    int low = 0;
    int mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        int curop = _lineinfos[mid]._op;
        if(curop > op) {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    if (is_line_op)
        *is_line_op = _lineinfos[mid]._is_line_op;

    if (hint)
        *hint = mid;

    return line;
}